

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

void __thiscall r_exec::TPX::TPX(TPX *this,AutoFocusController *auto_focus,_Fact *target)

{
  BindingMap *pBVar1;
  Code *c;
  P<r_exec::BindingMap> local_38;
  P<r_exec::BindingMap> bm;
  _Fact *target_local;
  AutoFocusController *auto_focus_local;
  TPX *this_local;
  
  core::_Object::_Object(&this->super__Object);
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__TPX_002ecbd0;
  this->auto_focus = auto_focus;
  core::P<r_exec::_Fact>::P(&this->target);
  core::P<r_exec::BindingMap>::P(&this->target_bindings);
  core::P<r_exec::_Fact>::P(&this->abstracted_target);
  core::P<r_exec::CSTController>::P(&this->cst_hook);
  std::vector<core::P<r_exec::BindingMap>,_std::allocator<core::P<r_exec::BindingMap>_>_>::vector
            (&this->new_maps);
  pBVar1 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(pBVar1);
  core::P<r_exec::BindingMap>::P(&local_38,pBVar1);
  pBVar1 = core::P<r_exec::BindingMap>::operator->(&local_38);
  c = BindingMap::abstract_object(pBVar1,(Code *)target,false);
  core::P<r_exec::_Fact>::operator=(&this->abstracted_target,(_Fact *)c);
  core::P<r_exec::_Fact>::operator=(&this->target,target);
  core::P<r_exec::BindingMap>::operator=(&this->target_bindings,&local_38);
  core::P<r_exec::BindingMap>::~P(&local_38);
  return;
}

Assistant:

TPX::TPX(AutoFocusController *auto_focus, _Fact *target): _Object(), auto_focus(auto_focus)   // called by CTPX's ctor.
{
    P<BindingMap> bm = new BindingMap();
    abstracted_target = (_Fact *)bm->abstract_object(target, false);
    this->target = target;
    target_bindings = bm;
}